

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O1

string * __thiscall
BayesianGameWithClusterInfo::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,BayesianGameWithClusterInfo *this)

{
  element_type *peVar1;
  pointer ppvVar2;
  vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *pvVar3;
  element_type *peVar4;
  pointer puVar5;
  JointBeliefInterface *pJVar6;
  int iVar7;
  undefined4 extraout_var;
  ostream *poVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  undefined4 extraout_var_00;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  pointer ppTVar13;
  uint uVar14;
  pointer ppJVar15;
  pointer puVar16;
  stringstream ss;
  stringstream ss_1;
  ulong local_548;
  char *local_540;
  long *local_530;
  long local_528;
  long local_520 [2];
  long *local_510;
  long local_508;
  long local_500 [2];
  ios_base *local_4f0;
  BayesianGameBase *local_4e8;
  ulong local_4e0;
  ostream *local_4d8;
  pointer local_4d0;
  stringstream local_4c8 [16];
  long local_4b8 [14];
  ios_base local_448 [264];
  string local_340 [4];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_4c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4b8,"Previous joint policy:",0x16);
  std::ios::widen((char)*(undefined8 *)(local_4b8[0] + -0x18) + (char)local_4b8);
  std::ostream::put((char)local_4b8);
  std::ostream::flush();
  lVar10 = 0x24;
  local_540 = "There is no previous BG or BG-policy";
  if (((this->_m_pBGJPol).px != (element_type *)0x0) && ((this->_m_pBG).px != (element_type *)0x0))
  {
    uVar14 = 0;
    local_540 = "that lead to the following BG:";
    while( true ) {
      iVar7 = (*(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
                super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
                super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
                _vptr_Interface_ProblemToPolicyDiscrete[3])();
      uVar11 = (ulong)uVar14;
      if (CONCAT44(extraout_var,iVar7) <= uVar11) break;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"agI=",4);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      peVar1 = (this->_m_pBG).px;
      ppvVar2 = (peVar1->_m_typeLists).
                super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(peVar1->_m_typeLists).
                        super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar2 >> 3) <= uVar11)
      {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar11);
      }
      pvVar3 = ppvVar2[uVar11];
      ppTVar13 = *(pointer *)
                  &(pvVar3->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>).
                   _M_impl;
      if (ppTVar13 !=
          (pvVar3->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar12 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"tI ",3);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," - ",3);
          TypeCluster::SoftPrint_abi_cxx11_(local_340,*ppTVar13);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_340[0]._M_dataplus._M_p,local_340[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," Action: ",9);
          peVar4 = (this->_m_pBGJPol).px;
          (*(peVar4->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x13])
                    (peVar4,uVar11,uVar12);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340[0]._M_dataplus._M_p != &local_340[0].field_2) {
            operator_delete(local_340[0]._M_dataplus._M_p,
                            local_340[0].field_2._M_allocated_capacity + 1);
          }
          ppTVar13 = ppTVar13 + 1;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (ppTVar13 !=
                 (pvVar3->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish);
      }
      uVar14 = uVar14 + 1;
    }
    lVar10 = 0x1e;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,local_540,lVar10);
  std::ios::widen((char)*(undefined8 *)(local_4b8[0] + -0x18) + (char)local_4b8);
  std::ostream::put((char)local_4b8);
  std::ostream::flush();
  BayesianGameForDecPOMDPStage::SoftPrint_abi_cxx11_
            (local_340,&this->super_BayesianGameForDecPOMDPStage);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4b8,local_340[0]._M_dataplus._M_p,local_340[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340[0]._M_dataplus._M_p != &local_340[0].field_2) {
    operator_delete(local_340[0]._M_dataplus._M_p,local_340[0].field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4b8,"This BG is clustered/clusterable.",0x21);
  std::ios::widen((char)*(undefined8 *)(local_4b8[0] + -0x18) + (char)local_4b8);
  std::ostream::put((char)local_4b8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4b8,"Joint beliefs assoc. with each joint type:",0x2a);
  std::ios::widen((char)*(undefined8 *)(local_4b8[0] + -0x18) + (char)local_4b8);
  std::ostream::put((char)local_4b8);
  std::ostream::flush();
  ppJVar15 = (this->super_BayesianGameForDecPOMDPStage)._m_JBs.
             super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppJVar15 !=
      (this->super_BayesianGameForDecPOMDPStage)._m_JBs.
      super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_4e8 = (BayesianGameBase *)
                &(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff;
    local_4f0 = aiStack_138;
    local_548 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"jtI=",4);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"=",1);
      local_4e0 = local_548;
      local_4d8 = poVar8;
      local_4d0 = ppJVar15;
      pvVar9 = BayesianGameBase::JointToIndividualTypeIndices(local_4e8,(Index)local_548);
      std::__cxx11::stringstream::stringstream(local_1b8);
      puVar16 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar5 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"< ",2);
      for (; puVar16 != puVar5; puVar16 = puVar16 + 1) {
        if (puVar16 !=
            (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_340);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_340[0].field_2);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
        std::ios_base::~ios_base(local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_510,local_508);
        if (local_510 != local_500) {
          operator_delete(local_510,local_500[0] + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," >",2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_4f0);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_4d8,(char *)local_530,local_528);
      ppJVar15 = local_4d0;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", repres. jaohI=",0x10);
      if ((ulong)((long)(this->_m_jaohReps).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->_m_jaohReps).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= local_4e0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", jb=",5);
      pJVar6 = *ppJVar15;
      (**(code **)(*(long *)((long)&pJVar6->field_0x0 + *(long *)((long)*pJVar6 + -0xb8)) + 0x60))
                (local_340,(long)&pJVar6->field_0x0 + *(long *)((long)*pJVar6 + -0xb8));
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_340[0]._M_dataplus._M_p,local_340[0]._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340[0]._M_dataplus._M_p != &local_340[0].field_2) {
        operator_delete(local_340[0]._M_dataplus._M_p,local_340[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (local_530 != local_520) {
        operator_delete(local_530,local_520[0] + 1);
      }
      ppJVar15 = ppJVar15 + 1;
      local_548 = (ulong)((Index)local_548 + 1);
    } while (ppJVar15 !=
             (this->super_BayesianGameForDecPOMDPStage)._m_JBs.
             super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4b8,"Type lists of agents:",0x15);
  std::ios::widen((char)*(undefined8 *)(local_4b8[0] + -0x18) + (char)local_4b8);
  std::ostream::put((char)local_4b8);
  std::ostream::flush();
  uVar14 = 0;
  while( true ) {
    iVar7 = (*(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
              super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])();
    uVar11 = (ulong)uVar14;
    if (CONCAT44(extraout_var_00,iVar7) <= uVar11) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_4c8);
      std::ios_base::~ios_base(local_448);
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"agI=",4);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", types:",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    ppvVar2 = (this->_m_typeLists).
              super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_m_typeLists).
                      super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar2 >> 3) <= uVar11)
    break;
    pvVar3 = ppvVar2[uVar11];
    ppTVar13 = (pvVar3->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    if (ppTVar13 !=
        (pvVar3->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"tI ",3);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," - ",3);
        TypeCluster::SoftPrint_abi_cxx11_(local_340,*ppTVar13);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_340[0]._M_dataplus._M_p,local_340[0]._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340[0]._M_dataplus._M_p != &local_340[0].field_2) {
          operator_delete(local_340[0]._M_dataplus._M_p,
                          local_340[0].field_2._M_allocated_capacity + 1);
        }
        ppTVar13 = ppTVar13 + 1;
      } while (ppTVar13 !=
               (pvVar3->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    uVar14 = uVar14 + 1;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar11);
}

Assistant:

string BayesianGameWithClusterInfo::SoftPrint() const
{
    stringstream ss;
    ss << "Previous joint policy:"<<endl;
    if(_m_pBGJPol != 0 && _m_pBG != 0)
    {
        for(Index agI=0; agI < GetNrAgents(); agI++)
        {
            ss << "agI=" << agI <<endl;
            TypeClusterList* tl = _m_pBG->_m_typeLists.at(agI);
            {
                Index i=0;
                for(TypeClusterList::const_iterator it = tl->begin();
                        it != tl->end(); it++, i++)
                {
                    ss << "tI "<< i << " - " << (*it)->SoftPrint() 
                        << " Action: " << _m_pBGJPol->GetActionIndex(agI, i)
                        << endl;

                }
            }
        }
        ss << "that lead to the following BG:"<<endl;
    }
    else
        ss << "There is no previous BG or BG-policy"<<endl;



    ss << BayesianGameForDecPOMDPStage::SoftPrint(); 
    ss << "This BG is clustered/clusterable."<<endl;
    ss << "Joint beliefs assoc. with each joint type:"<<endl;
    {
        Index i=0;
        for(vector< JointBeliefInterface* >::const_iterator it=_m_JBs.begin(); 
                it != _m_JBs.end(); it++, i++)
        {
            ss << "jtI="<<i
                << "=" << PrintTools::SoftPrintVector(
                        JointToIndividualTypeIndices(i)
                        )
                << ", repres. jaohI="<< _m_jaohReps.at(i)
            //GetPUDecPOMDPDiscrete()->GetJointActionObservationHistoryTree(_m_jaohReps.at(i))->
                    //GetJointActionObservationHistory()->
                    //SoftPrintJointIndicesconst()
                <<", jb="<< (*it)->SoftPrint() 
            << endl;
        }
    }
    ss << "Type lists of agents:"<<endl;
    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        ss << "agI=" << agI << ", types:"<<endl;
        TypeClusterList* tl = _m_typeLists.at(agI);
        {
            Index i=0;
            for(TypeClusterList::const_iterator it = tl->begin();
                    it != tl->end(); it++, i++)
            {
                ss << "tI "<< i << " - " << (*it)->SoftPrint() << endl;
            }
        }
    }

    return(ss.str());
}